

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O0

uchar getImpulseValue(double p,double pa,double pb,uchar value,int *freq)

{
  uchar local_31;
  uchar newValue;
  int *freq_local;
  uchar value_local;
  double pb_local;
  double pa_local;
  double p_local;
  
  if (pa <= p) {
    if ((p < pa) || (pa + pb <= p)) {
      freq[2] = freq[2] + 1;
      local_31 = value;
    }
    else {
      local_31 = 0xff;
      freq[1] = freq[1] + 1;
    }
  }
  else {
    local_31 = '\0';
    *freq = *freq + 1;
  }
  return local_31;
}

Assistant:

unsigned char getImpulseValue(double p, double pa, double pb, unsigned char value, int *freq) {
    unsigned char newValue = 0;
    if (p < pa) {
        newValue = 0;
        freq[0]++;
    } else if ((p >= pa) && (p < (pa + pb))) {
        newValue = 255;
        freq[1]++;
    } else {
        newValue = value;
        freq[2]++;
    }
    return newValue;
}